

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O2

void __thiscall Assimp::ObjExporter::AddNode(ObjExporter *this,aiNode *nd,aiMatrix4x4 *mParent)

{
  aiMesh *m;
  aiNode *name;
  uint i;
  ulong uVar1;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4t<float> local_68;
  
  local_68.a1 = mParent->a1;
  local_68.a2 = mParent->a2;
  local_68.a3 = mParent->a3;
  local_68.a4 = mParent->a4;
  local_68.b1 = mParent->b1;
  local_68.b2 = mParent->b2;
  local_68.b3 = mParent->b3;
  local_68.b4 = mParent->b4;
  local_68.c1 = mParent->c1;
  local_68.c2 = mParent->c2;
  local_68.c3 = mParent->c3;
  local_68.c4 = mParent->c4;
  local_68.d1 = mParent->d1;
  local_68.d2 = mParent->d2;
  local_68.d3 = mParent->d3;
  local_68.d4 = mParent->d4;
  aiMatrix4x4t<float>::operator*=(&local_68,&nd->mTransformation);
  for (uVar1 = 0; uVar1 < nd->mNumMeshes; uVar1 = uVar1 + 1) {
    m = this->pScene->mMeshes[nd->mMeshes[uVar1]];
    if (m == (aiMesh *)0x0) {
      m = (aiMesh *)0x0;
      name = nd;
    }
    else {
      name = (aiNode *)&m->mName;
    }
    AddMesh(this,&name->mName,m,&local_68);
  }
  for (uVar1 = 0; uVar1 < nd->mNumChildren; uVar1 = uVar1 + 1) {
    AddNode(this,nd->mChildren[uVar1],&local_68);
  }
  return;
}

Assistant:

void ObjExporter::AddNode(const aiNode* nd, const aiMatrix4x4& mParent) {
    const aiMatrix4x4& mAbs = mParent * nd->mTransformation;

    aiMesh *cm( nullptr );
    for(unsigned int i = 0; i < nd->mNumMeshes; ++i) {
        cm = pScene->mMeshes[nd->mMeshes[i]];
        if (nullptr != cm) {
            AddMesh(cm->mName, pScene->mMeshes[nd->mMeshes[i]], mAbs);
        } else {
            AddMesh(nd->mName, pScene->mMeshes[nd->mMeshes[i]], mAbs);
        }
    }

    for(unsigned int i = 0; i < nd->mNumChildren; ++i) {
        AddNode(nd->mChildren[i], mAbs);
    }
}